

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.c
# Opt level: O3

MUSTACHE_TEMPLATE *
mustache_compile(char *templ_data,size_t templ_size,MUSTACHE_PARSER *parser,void *parser_data,
                uint flags)

{
  long lVar1;
  char *__src;
  int *piVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  uint8_t *puVar5;
  uint8_t *__ptr;
  char cVar6;
  int iVar7;
  int iVar8;
  MUSTACHE_TEMPLATE *pMVar9;
  ulong uVar10;
  ulong uVar11;
  MUSTACHE_PARSER *pMVar12;
  long lVar13;
  ulong uVar14;
  size_t sVar15;
  size_t sVar16;
  uint64_t num;
  char *pcVar17;
  MUSTACHE_TEMPLATE *pMVar18;
  ulong uVar19;
  MUSTACHE_TEMPLATE *pMVar20;
  size_t sVar21;
  long lVar22;
  MUSTACHE_BUFFER *pMVar23;
  byte bVar24;
  int iVar25;
  MUSTACHE_TEMPLATE *pMVar26;
  bool bVar27;
  MUSTACHE_BUFFER insns;
  char closer [32];
  char opener [32];
  MUSTACHE_TEMPLATE *local_1a8;
  size_t local_1a0;
  ulong local_198;
  size_t local_188;
  MUSTACHE_BUFFER local_168;
  ulong local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  long local_138;
  ulong local_130;
  ulong uStack_128;
  ulong local_120;
  ulong local_118;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  char *local_f0;
  MUSTACHE_BUFFER local_e8;
  long local_c8;
  ulong local_c0;
  MUSTACHE_BUFFER local_b8;
  MUSTACHE_BUFFER local_98;
  MUSTACHE_TEMPLATE *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_168.data = (uint8_t *)0x0;
  local_168.n = 0;
  local_168.alloc = 0;
  local_e8.alloc = 0;
  pMVar12 = &mustache_compile::default_parser;
  if (parser != (MUSTACHE_PARSER *)0x0) {
    pMVar12 = parser;
  }
  local_e8.data = (uint8_t *)0x0;
  local_e8.n = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0x7b7b;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0x7d7d;
  uStack_70 = 0;
  local_b8.alloc = 0;
  local_b8.data = (uint8_t *)0x0;
  local_b8.n = 0;
  if (templ_size == 0) {
    bVar27 = true;
    sVar15 = 0;
    goto LAB_00108150;
  }
  local_148 = CONCAT44(local_148._4_4_,0xb);
  local_130 = 0;
  uStack_128 = 0;
  lVar22 = 0x70;
  pMVar9 = (MUSTACHE_TEMPLATE *)malloc(0x70);
  local_1a8 = (MUSTACHE_TEMPLATE *)0x0;
  if (pMVar9 != (MUSTACHE_TEMPLATE *)0x0) {
    local_b8.alloc = 0x70;
    *(ulong *)(pMVar9 + 0x30) = local_118;
    *(ulong *)(pMVar9 + 0x20) = uStack_128;
    *(ulong *)(pMVar9 + 0x28) = local_120;
    *(long *)(pMVar9 + 0x10) = local_138;
    *(ulong *)(pMVar9 + 0x18) = local_130;
    *(int *)pMVar9 = (int)local_148;
    *(uint *)(pMVar9 + 4) = local_148._4_4_;
    *(int *)(pMVar9 + 8) = (int)uStack_140;
    *(int *)(pMVar9 + 0xc) = uStack_140._4_4_;
    local_b8.n = 0x38;
    local_148 = (ulong)local_148._4_4_ << 0x20;
    local_1a0 = 2;
    lVar13 = 1;
    uVar19 = 0;
    local_108 = 1;
    uVar11 = 0;
    local_188 = 2;
    uVar10 = 0;
    local_100 = templ_size;
    local_f0 = templ_data;
    local_b8.data = (uint8_t *)pMVar9;
LAB_00107444:
    uVar14 = local_188 + uVar11;
    iVar25 = (int)local_1a8;
    uVar4 = (uint)lVar22;
    if (templ_size < uVar14) {
      if (local_1a0 + uVar11 <= templ_size) {
        iVar7 = bcmp(templ_data + uVar11,&local_78,local_1a0);
LAB_001075c4:
        if ((int)uVar10 != 0 || iVar7 != 0) {
          if (iVar7 == 0) goto LAB_00107614;
          goto LAB_00107665;
        }
        (*pMVar12->parse_error)
                  (2,"Tag closer has no opener.",(uint)local_108,(uint)lVar13,parser_data);
        local_1a8 = (MUSTACHE_TEMPLATE *)(ulong)(iVar25 + 1);
        uVar10 = 0;
LAB_0010769d:
        lVar13 = lVar13 + 1;
        local_198 = uVar11 + 1;
        goto LAB_00107e6a;
      }
LAB_00107665:
      cVar6 = templ_data[uVar11];
      if ((cVar6 != '\r') && (cVar6 != '\n')) goto LAB_0010769d;
      if ((uVar10 & 0xfffffffd) != 0) {
        (*pMVar12->parse_error)(1,"Tag opener has no closer.",(uint)local_f8,uVar4,parser_data);
        local_1a8 = (MUSTACHE_TEMPLATE *)(ulong)(iVar25 + 1);
        local_148 = local_148 & 0xffffffff00000000;
        cVar6 = templ_data[uVar11];
        uVar10 = 0;
      }
      local_198 = uVar11 + (cVar6 == '\r');
      if (local_198 < templ_size) {
        local_198 = (templ_data[local_198] == '\n') + local_198;
      }
      if (((int)uVar10 != 0) || (templ_size <= local_198)) {
LAB_00107792:
        local_108 = local_108 + 1;
        lVar13 = 1;
        goto LAB_00107e6a;
      }
      local_148 = CONCAT44(local_148._4_4_,0xb);
      local_130 = local_198;
      uStack_128 = local_198;
      iVar25 = mustache_buffer_insert(&local_b8,local_b8.n,&local_148,0x38);
      if (iVar25 == 0) {
        local_148 = local_148 & 0xffffffff00000000;
        uVar10 = 0;
        uVar19 = local_198;
        goto LAB_00107792;
      }
      goto LAB_00108549;
    }
    local_c8 = lVar13;
    local_c0 = uVar10;
    iVar8 = bcmp(templ_data + uVar11,&local_58,local_188);
    if (local_1a0 + uVar11 <= templ_size) {
      iVar7 = bcmp(templ_data + uVar11,&local_78,local_1a0);
      templ_data = local_f0;
      lVar13 = local_c8;
      uVar10 = local_c0;
      if (iVar7 != 0 || iVar8 != 0) {
        if (iVar8 != 0) goto LAB_001075c4;
        goto LAB_001076ac;
      }
      if ((int)local_c0 == 0) {
        uVar10 = 0;
        goto LAB_0010787e;
      }
LAB_00107614:
      local_198 = local_1a0 + uVar11;
      lVar13 = lVar13 + local_1a0;
      iVar7 = (int)uVar10;
      if (iVar7 == 1) {
        cVar6 = templ_data[uVar11 - 1];
        if ((cVar6 == '=') || (templ_size <= local_198 + local_1a0)) {
LAB_00107af4:
          if (cVar6 != '=') goto LAB_00107b1a;
          if ((long)local_150 < (long)uVar11) {
            uVar11 = uVar11 - 1;
          }
        }
        else {
          if ((templ_data[local_198] == '=') &&
             (iVar8 = bcmp(templ_data + local_198 + 1,&local_78,local_1a0), iVar8 == 0)) {
            lVar1 = local_1a0 + uVar11;
            uVar11 = lVar1 + 1;
            local_198 = local_198 + 1 + local_1a0;
            lVar13 = lVar13 + 1 + local_1a0;
            cVar6 = templ_data[lVar1];
            templ_size = local_100;
            goto LAB_00107af4;
          }
LAB_00107b1a:
          (*pMVar12->parse_error)
                    (3,"Tag closer is incompatible with its opener.",(uint)local_108,(uint)lVar13,
                     parser_data);
          local_1a8 = (MUSTACHE_TEMPLATE *)(ulong)(iVar25 + 1);
          templ_size = local_100;
        }
LAB_00107b74:
        uStack_128 = local_198;
        uVar10 = uVar11;
        if (((templ_size <= local_198) || (templ_data[local_198] == '\r')) ||
           (templ_data[local_198] == '\n')) {
          uVar14 = uVar19;
          if ((long)uVar19 < 1) {
            if (uVar19 == 0) goto LAB_00107bd7;
            bVar24 = templ_data[uVar19 - 1];
LAB_00107bc5:
            if ((bVar24 != 0xd) && (bVar24 != 10)) goto joined_r0x00107c30;
          }
          else {
            do {
              bVar24 = templ_data[uVar14 - 1];
              if ((0x20 < (ulong)bVar24) || ((0x100001a00U >> ((ulong)bVar24 & 0x3f) & 1) == 0))
              goto LAB_00107bc5;
              bVar27 = 1 < (long)uVar14;
              uVar14 = uVar14 - 1;
            } while (bVar27);
LAB_00107bd7:
            uVar14 = 0;
          }
          if ((local_198 < templ_size) && (templ_data[local_198] == '\r')) {
            uStack_128 = local_198 + 1;
          }
          local_130 = uVar14;
          uVar19 = uVar14;
          if ((uStack_128 < templ_size) && (templ_data[uStack_128] == '\n')) {
            uStack_128 = uStack_128 + 1;
          }
        }
      }
      else if (iVar7 == 4) {
        if (((long)uVar11 <= (long)local_150) || (templ_data[uVar11 - 1] != '}')) {
          if (local_1a0 != 0) {
            sVar16 = 0;
            do {
              if (*(char *)((long)&local_78 + sVar16) != '}') goto LAB_00107992;
              sVar16 = sVar16 + 1;
            } while (local_1a0 != sVar16);
          }
          if ((local_198 < templ_size) && (templ_data[local_198] == '}')) {
            local_198 = local_198 + 1;
            lVar13 = lVar13 + 1;
          }
          else {
LAB_00107992:
            (*pMVar12->parse_error)
                      (3,"Tag closer is incompatible with its opener.",(uint)local_108,(uint)lVar13,
                       parser_data);
            local_1a8 = (MUSTACHE_TEMPLATE *)(ulong)(iVar25 + 1);
            templ_size = local_100;
          }
          goto LAB_001079e7;
        }
        uVar11 = uVar11 - 1;
        uVar10 = uVar11;
        uStack_128 = local_198;
      }
      else {
LAB_001079e7:
        uVar10 = uVar11;
        uStack_128 = local_198;
        if (iVar7 - 6U < 0xfffffffd) goto LAB_00107b74;
      }
joined_r0x00107c30:
      for (; (long)local_150 < (long)uVar11; uVar11 = uVar11 - 1) {
        if ((0x20 < (ulong)(byte)templ_data[uVar11 - 1]) ||
           ((0x100001a00U >> ((ulong)(byte)templ_data[uVar11 - 1] & 0x3f) & 1) == 0)) {
          local_118 = uVar11;
          if (iVar7 == 2) goto LAB_00107e20;
          goto LAB_00107cb1;
        }
        uVar10 = local_150;
      }
      local_118 = uVar10;
      if (iVar7 != 2) {
        (*pMVar12->parse_error)(4,"Tag has no name.",(uint)local_f8,uVar4,parser_data);
        local_1a8 = (MUSTACHE_TEMPLATE *)(ulong)((int)local_1a8 + 1);
        uVar11 = uVar10;
LAB_00107cb1:
        pcVar17 = templ_data + local_150;
        uVar10 = uVar11 - local_150;
        if (iVar7 != 1) {
          if (uVar10 == 1) {
            if (*pcVar17 != '.') {
              if (templ_data[uVar11 - 1] == '.') goto LAB_00107d2b;
LAB_00107de8:
              uVar11 = 0;
              do {
                uVar14 = (ulong)(byte)pcVar17[uVar11];
                if (uVar14 < 0x2f) {
                  if (uVar14 == 0x2e) {
                    if ((uVar11 + 1 < uVar10) && (pcVar17[uVar11 + 1] == '.')) goto LAB_00107d2b;
                  }
                  else if ((0x100001a00U >> (uVar14 & 0x3f) & 1) != 0) goto LAB_00107d2b;
                }
                uVar11 = uVar11 + 1;
              } while (uVar11 != uVar10);
            }
          }
          else if ((*pcVar17 == '.') || (templ_data[uVar11 - 1] == '.')) {
LAB_00107d2b:
            (*pMVar12->parse_error)(5,"Tag name is invalid.",(uint)local_f8,uVar4,parser_data);
            local_1a8 = (MUSTACHE_TEMPLATE *)(ulong)((int)local_1a8 + 1);
          }
          else if (uVar11 != local_150) goto LAB_00107de8;
          goto LAB_00107e20;
        }
        if (uVar11 != local_150) {
          uVar11 = 0;
          do {
            uVar14 = (ulong)(byte)pcVar17[uVar11];
            if (uVar14 < 0x3e) {
              if ((0x100001a00U >> (uVar14 & 0x3f) & 1) != 0) {
                uVar14 = uVar11;
                if (uVar11 < uVar10 && uVar11 - 1 < 0x20) goto LAB_00107d8c;
                break;
              }
              if (uVar14 == 0x3d) break;
            }
            uVar11 = uVar11 + 1;
          } while (uVar10 != uVar11);
        }
        goto LAB_00107dac;
      }
      goto LAB_00107e20;
    }
    lVar13 = local_c8;
    uVar10 = local_c0;
    templ_data = local_f0;
    if (iVar8 != 0) goto LAB_00107665;
LAB_001076ac:
    templ_data = local_f0;
    uVar10 = local_c0;
    if ((local_c0 & 0xfffffffd) != 0) {
      (*pMVar12->parse_error)(1,"Tag opener has no closer.",(uint)local_f8,uVar4,parser_data);
      local_1a8 = (MUSTACHE_TEMPLATE *)(ulong)(iVar25 + 1);
      local_148 = local_148 & 0xffffffff00000000;
      uVar10 = 0;
    }
LAB_0010787e:
    uStack_140 = local_108;
    if (uVar14 < templ_size) {
      bVar24 = templ_data[uVar14];
      if (bVar24 < 0x3d) {
        if (bVar24 < 0x26) {
          if (bVar24 == 0x21) {
            local_148 = CONCAT44(local_148._4_4_,2);
            uVar14 = uVar14 + 1;
            uVar10 = 2;
          }
          else if (bVar24 == 0x23) {
            local_148 = CONCAT44(local_148._4_4_,6);
            uVar14 = uVar14 + 1;
            uVar10 = 6;
          }
          else {
LAB_00107ab1:
            local_148 = CONCAT44(local_148._4_4_,3);
            uVar10 = 3;
          }
        }
        else if (bVar24 == 0x26) {
          local_148 = CONCAT44(local_148._4_4_,5);
          uVar14 = uVar14 + 1;
          uVar10 = 5;
        }
        else {
          if (bVar24 != 0x2f) goto LAB_00107ab1;
          local_148 = CONCAT44(local_148._4_4_,8);
          uVar14 = uVar14 + 1;
          uVar10 = 8;
        }
      }
      else if (bVar24 < 0x5e) {
        if (bVar24 == 0x3d) {
          local_148 = CONCAT44(local_148._4_4_,1);
          uVar14 = uVar14 + 1;
          uVar10 = 1;
        }
        else {
          if (bVar24 != 0x3e) goto LAB_00107ab1;
          local_148 = CONCAT44(local_148._4_4_,10);
          uVar14 = uVar14 + 1;
          uVar10 = 10;
        }
      }
      else if (bVar24 == 0x5e) {
        local_148 = CONCAT44(local_148._4_4_,7);
        uVar14 = uVar14 + 1;
        uVar10 = 7;
      }
      else {
        if (bVar24 != 0x7b) goto LAB_00107ab1;
        local_148 = CONCAT44(local_148._4_4_,4);
        uVar14 = uVar14 + 1;
        uVar10 = 4;
      }
    }
    local_150 = uVar14;
    if (uVar14 < templ_size) {
      do {
        local_150 = uVar14;
        if ((0x20 < (ulong)(byte)templ_data[uVar14]) ||
           ((0x100001a00U >> ((ulong)(byte)templ_data[uVar14] & 0x3f) & 1) == 0)) break;
        uVar14 = uVar14 + 1;
        local_150 = templ_size;
      } while (templ_size != uVar14);
    }
    lVar13 = (local_c8 - uVar11) + local_150;
    local_f8 = local_108;
    lVar22 = local_c8;
    uVar19 = uVar11;
    local_198 = local_150;
    local_138 = local_c8;
    local_130 = uVar11;
    local_120 = local_150;
    goto LAB_00107e6a;
  }
LAB_00108564:
  free(local_1a8);
  pMVar9 = (MUSTACHE_TEMPLATE *)0x0;
  pMVar18 = (MUSTACHE_TEMPLATE *)0x0;
  pMVar26 = (MUSTACHE_TEMPLATE *)0x0;
LAB_00108574:
  free(pMVar9);
  pMVar20 = pMVar26;
  pMVar9 = pMVar18;
  pMVar26 = (MUSTACHE_TEMPLATE *)0x0;
LAB_00108582:
  free(pMVar9);
  free(pMVar20);
  return pMVar26;
  while (uVar14 = uVar14 + 1, uVar10 != uVar14) {
LAB_00107d8c:
    if ((0x20 < (ulong)(byte)pcVar17[uVar14]) ||
       ((0x100001a00U >> ((ulong)(byte)pcVar17[uVar14] & 0x3f) & 1) == 0)) {
      if ((uVar11 < uVar14) && (sVar16 = uVar10 - uVar14, uVar14 <= uVar10 && sVar16 != 0)) {
        __src = pcVar17 + uVar14;
        goto LAB_00107e9d;
      }
      break;
    }
  }
  goto LAB_00107dac;
  while (uVar14 = uVar14 + 1, uVar10 != uVar14) {
LAB_00107e9d:
    if (((ulong)(byte)pcVar17[uVar14] < 0x21) &&
       ((0x100001a00U >> ((ulong)(byte)pcVar17[uVar14] & 0x3f) & 1) != 0)) goto LAB_00107dac;
  }
  if ((long)sVar16 < 0x21) {
    memcpy(&local_58,pcVar17,uVar11);
    memcpy(&local_78,__src,sVar16);
    local_1a0 = sVar16;
    local_188 = uVar11;
    goto LAB_00107dd9;
  }
LAB_00107dac:
  (*pMVar12->parse_error)
            (10,"Invalid specification of delimiters.",(uint)local_f8,uVar4,parser_data);
  local_1a8 = (MUSTACHE_TEMPLATE *)(ulong)((int)local_1a8 + 1);
LAB_00107dd9:
  local_148 = CONCAT44(local_148._4_4_,2);
LAB_00107e20:
  iVar25 = mustache_buffer_insert(&local_b8,local_b8.n,&local_148,0x38);
  if (iVar25 != 0) {
LAB_00108549:
    local_1a8 = (MUSTACHE_TEMPLATE *)local_b8.data;
    goto LAB_00108564;
  }
  local_148 = local_148 & 0xffffffff00000000;
  uVar10 = 0;
  templ_size = local_100;
LAB_00107e6a:
  uVar11 = local_198;
  sVar15 = local_b8.n;
  puVar5 = local_b8.data;
  if (templ_size <= uVar11) goto LAB_00107f08;
  goto LAB_00107444;
LAB_00107f08:
  bVar27 = (int)local_1a8 == 0;
  uVar11 = local_b8.n >> 3;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar11;
  local_98.data = (uint8_t *)0x0;
  local_98.n = 0;
  local_98.alloc = 0;
  if ((auVar3 * ZEXT816(0x2492492492492493) & (undefined1  [16])0xffffffff) != (undefined1  [16])0x0
     ) {
    local_1a8 = (MUSTACHE_TEMPLATE *)local_b8.data;
    lVar22 = 0;
    iVar25 = 0;
    do {
      if (*(int *)(puVar5 + lVar22) - 8U < 2) {
        if (local_98.n == 0) {
          (*pMVar12->parse_error)
                    (7,"Section-closing tag has no opener.",*(uint *)(puVar5 + lVar22 + 8),
                     *(uint *)(puVar5 + lVar22 + 0x10),parser_data);
          iVar25 = iVar25 + 1;
        }
        else {
          piVar2 = *(int **)(local_98.data + (local_98.n - 8));
          local_98.n = local_98.n - 8;
          sVar16 = *(long *)(piVar2 + 0xc) - *(long *)(piVar2 + 10);
          if ((sVar16 != *(long *)(puVar5 + lVar22 + 0x30) - *(long *)(puVar5 + lVar22 + 0x28)) ||
             (iVar7 = strncmp(local_f0 + *(long *)(piVar2 + 10),
                              local_f0 + *(long *)(puVar5 + lVar22 + 0x28),sVar16), iVar7 != 0)) {
            (*pMVar12->parse_error)
                      (8,
                       "Name of section-closing tag does not match corresponding section-opening tag."
                       ,*(uint *)(puVar5 + lVar22 + 8),*(uint *)(puVar5 + lVar22 + 0x10),parser_data
                      );
            (*pMVar12->parse_error)
                      (9,"The section-opening is located here.",piVar2[2],piVar2[4],parser_data);
            iVar25 = iVar25 + 1;
          }
          if (*piVar2 == 7) {
            *(undefined4 *)(puVar5 + lVar22) = 9;
          }
        }
      }
      else if (*(int *)(puVar5 + lVar22) - 6U < 2) {
        local_80 = (MUSTACHE_TEMPLATE *)(puVar5 + lVar22);
        iVar7 = mustache_buffer_insert(&local_98,local_98.n,&local_80,8);
        if (iVar7 != 0) {
          free(local_98.data);
          goto LAB_00108564;
        }
      }
      __ptr = local_98.data;
      lVar22 = lVar22 + 0x38;
      sVar21 = local_98.n;
    } while ((uVar11 / 7 & 0xffffffff) * 0x38 != lVar22);
    for (; sVar21 != 0; sVar21 = sVar21 - 8) {
      lVar22 = *(long *)(__ptr + (sVar21 - 8));
      (*pMVar12->parse_error)
                (6,"Section-opening tag has no closer.",*(uint *)(lVar22 + 8),
                 *(uint *)(lVar22 + 0x10),parser_data);
      iVar25 = iVar25 + 1;
    }
    free(__ptr);
    templ_size = local_100;
    templ_data = local_f0;
    if (iVar25 != 0) goto LAB_00108564;
  }
LAB_00108150:
  local_148 = local_148 & 0xffffffff00000000;
  local_130 = templ_size;
  uStack_128 = templ_size;
  iVar25 = mustache_buffer_insert(&local_b8,sVar15,&local_148,0x38);
  pMVar9 = (MUSTACHE_TEMPLATE *)local_b8.data;
  local_1a8 = (MUSTACHE_TEMPLATE *)local_b8.data;
  if ((iVar25 == 0) && (bVar27)) {
    lVar22 = 0;
    pMVar20 = (MUSTACHE_TEMPLATE *)local_b8.data;
    do {
      if (lVar22 < *(long *)(pMVar20 + 0x18)) {
        uStack_140 = CONCAT17(1,(undefined7)uStack_140);
        iVar25 = mustache_buffer_insert(&local_168,local_168.n,(void *)((long)&uStack_140 + 7),1);
        pMVar18 = (MUSTACHE_TEMPLATE *)local_e8.data;
        pMVar26 = (MUSTACHE_TEMPLATE *)local_168.data;
        if (((iVar25 != 0) ||
            (iVar25 = mustache_buffer_insert_num
                                (&local_168,local_168.n,*(long *)(pMVar20 + 0x18) - lVar22),
            pMVar18 = (MUSTACHE_TEMPLATE *)local_e8.data,
            pMVar26 = (MUSTACHE_TEMPLATE *)local_168.data, iVar25 != 0)) ||
           (iVar25 = mustache_buffer_insert
                               (&local_168,local_168.n,templ_data + lVar22,
                                *(long *)(pMVar20 + 0x18) - lVar22),
           pMVar18 = (MUSTACHE_TEMPLATE *)local_e8.data,
           pMVar26 = (MUSTACHE_TEMPLATE *)local_168.data, iVar25 != 0)) goto LAB_00108574;
      }
      pMVar23 = &local_168;
      switch(*(int *)pMVar20) {
      case 0:
        goto switchD_0010822a_caseD_0;
      default:
        goto switchD_0010822a_caseD_1;
      case 3:
      case 4:
      case 5:
        uStack_140 = CONCAT17(3,(undefined7)uStack_140);
        iVar25 = mustache_buffer_insert(&local_168,local_168.n,(void *)((long)&uStack_140 + 7),1);
        pMVar18 = (MUSTACHE_TEMPLATE *)local_e8.data;
        pMVar26 = (MUSTACHE_TEMPLATE *)local_168.data;
        if ((iVar25 == 0) &&
           (iVar25 = mustache_compile_tagname
                               (&local_168,templ_data + *(long *)(pMVar20 + 0x28),
                                *(long *)(pMVar20 + 0x30) - *(long *)(pMVar20 + 0x28)),
           pMVar18 = (MUSTACHE_TEMPLATE *)local_e8.data,
           pMVar26 = (MUSTACHE_TEMPLATE *)local_168.data, iVar25 == 0)) {
          num = (ulong)(*(int *)pMVar20 == 3) | 4;
          uVar11 = local_168.n;
          goto LAB_001083af;
        }
        goto LAB_00108574;
      case 6:
        uStack_140 = CONCAT17(2,(undefined7)uStack_140);
        iVar25 = mustache_buffer_insert(&local_168,local_168.n,(void *)((long)&uStack_140 + 7),1);
        pMVar18 = (MUSTACHE_TEMPLATE *)local_e8.data;
        pMVar26 = (MUSTACHE_TEMPLATE *)local_168.data;
        if (iVar25 != 0) goto LAB_00108574;
        local_148 = local_168.n;
        iVar25 = mustache_buffer_insert(&local_e8,local_e8.n,&local_148,8);
        pMVar18 = (MUSTACHE_TEMPLATE *)local_e8.data;
        pMVar26 = (MUSTACHE_TEMPLATE *)local_168.data;
        if ((iVar25 != 0) ||
           (iVar25 = mustache_compile_tagname
                               (&local_168,templ_data + *(long *)(pMVar20 + 0x28),
                                *(long *)(pMVar20 + 0x30) - *(long *)(pMVar20 + 0x28)),
           pMVar18 = (MUSTACHE_TEMPLATE *)local_e8.data,
           pMVar26 = (MUSTACHE_TEMPLATE *)local_168.data, iVar25 != 0)) goto LAB_00108574;
        uStack_140 = CONCAT17(6,(undefined7)uStack_140);
        iVar25 = mustache_buffer_insert(&local_168,local_168.n,(void *)((long)&uStack_140 + 7),1);
        pMVar18 = (MUSTACHE_TEMPLATE *)local_e8.data;
        pMVar26 = (MUSTACHE_TEMPLATE *)local_168.data;
        if (iVar25 != 0) goto LAB_00108574;
        local_148 = local_168.n;
        sVar15 = 8;
        pMVar23 = &local_e8;
        pcVar17 = (char *)&local_148;
        sVar21 = local_e8.n;
        break;
      case 7:
        uStack_140 = CONCAT17(2,(undefined7)uStack_140);
        iVar25 = mustache_buffer_insert(&local_168,local_168.n,(void *)((long)&uStack_140 + 7),1);
        pMVar18 = (MUSTACHE_TEMPLATE *)local_e8.data;
        pMVar26 = (MUSTACHE_TEMPLATE *)local_168.data;
        if (iVar25 == 0) {
          local_148 = local_168.n;
          iVar25 = mustache_buffer_insert(&local_e8,local_e8.n,&local_148,8);
          pMVar18 = (MUSTACHE_TEMPLATE *)local_e8.data;
          pMVar26 = (MUSTACHE_TEMPLATE *)local_168.data;
          if ((iVar25 == 0) &&
             (iVar25 = mustache_compile_tagname
                                 (&local_168,templ_data + *(long *)(pMVar20 + 0x28),
                                  *(long *)(pMVar20 + 0x30) - *(long *)(pMVar20 + 0x28)),
             pMVar18 = (MUSTACHE_TEMPLATE *)local_e8.data,
             pMVar26 = (MUSTACHE_TEMPLATE *)local_168.data, iVar25 == 0)) {
            uStack_140 = CONCAT17(8,(undefined7)uStack_140);
            goto LAB_00108374;
          }
        }
        goto LAB_00108574;
      case 8:
        uStack_140 = CONCAT17(7,(undefined7)uStack_140);
        iVar25 = mustache_buffer_insert(&local_168,local_168.n,(void *)((long)&uStack_140 + 7),1);
        sVar15 = local_e8.n;
        puVar5 = local_e8.data;
        pMVar18 = (MUSTACHE_TEMPLATE *)local_e8.data;
        pMVar26 = (MUSTACHE_TEMPLATE *)local_168.data;
        if ((iVar25 == 0) &&
           (iVar25 = mustache_buffer_insert_num
                               (&local_168,local_168.n,
                                local_168.n - *(long *)(local_e8.data + (local_e8.n - 8))),
           pMVar18 = (MUSTACHE_TEMPLATE *)local_e8.data,
           pMVar26 = (MUSTACHE_TEMPLATE *)local_168.data, iVar25 == 0)) {
          uVar11 = *(ulong *)(puVar5 + (sVar15 - 0x10));
          local_e8.n = sVar15 - 0x10;
          goto LAB_001083a7;
        }
        goto LAB_00108574;
      case 9:
        uVar11 = *(ulong *)(local_e8.data + (local_e8.n - 8));
        local_e8.n = local_e8.n - 8;
LAB_001083a7:
        num = local_168.n - uVar11;
LAB_001083af:
        iVar25 = mustache_buffer_insert_num(&local_168,uVar11,num);
        goto LAB_00108525;
      case 10:
        uStack_140 = CONCAT17(9,(undefined7)uStack_140);
        iVar25 = mustache_buffer_insert(&local_168,local_168.n,(void *)((long)&uStack_140 + 7),1);
        pMVar18 = (MUSTACHE_TEMPLATE *)local_e8.data;
        pMVar26 = (MUSTACHE_TEMPLATE *)local_168.data;
        if (((iVar25 != 0) ||
            (iVar25 = mustache_buffer_insert_num
                                (&local_168,local_168.n,
                                 *(long *)(pMVar20 + 0x30) - *(long *)(pMVar20 + 0x28)),
            pMVar18 = (MUSTACHE_TEMPLATE *)local_e8.data,
            pMVar26 = (MUSTACHE_TEMPLATE *)local_168.data, iVar25 != 0)) ||
           (iVar25 = mustache_buffer_insert
                               (&local_168,local_168.n,templ_data + *(long *)(pMVar20 + 0x28),
                                *(long *)(pMVar20 + 0x30) - *(long *)(pMVar20 + 0x28)),
           pMVar18 = (MUSTACHE_TEMPLATE *)local_e8.data,
           pMVar26 = (MUSTACHE_TEMPLATE *)local_168.data, iVar25 != 0)) goto LAB_00108574;
        sVar15 = 0;
        while (((ulong)(byte)templ_data[sVar15 + *(long *)(pMVar20 + 0x18)] < 0x21 &&
               ((0x100001a00U >>
                 ((ulong)(byte)templ_data[sVar15 + *(long *)(pMVar20 + 0x18)] & 0x3f) & 1) != 0))) {
          sVar15 = sVar15 + 1;
        }
        iVar25 = mustache_buffer_insert_num(&local_168,local_168.n,sVar15);
        pMVar18 = (MUSTACHE_TEMPLATE *)local_e8.data;
        pMVar26 = (MUSTACHE_TEMPLATE *)local_168.data;
        if (iVar25 != 0) goto LAB_00108574;
        pcVar17 = templ_data + *(long *)(pMVar20 + 0x18);
        sVar21 = local_168.n;
        break;
      case 0xb:
        uStack_140 = CONCAT17(10,(undefined7)uStack_140);
LAB_00108374:
        sVar15 = 1;
        pcVar17 = (char *)((long)&uStack_140 + 7);
        sVar21 = local_168.n;
      }
      iVar25 = mustache_buffer_insert(pMVar23,sVar21,pcVar17,sVar15);
LAB_00108525:
      pMVar18 = (MUSTACHE_TEMPLATE *)local_e8.data;
      pMVar26 = (MUSTACHE_TEMPLATE *)local_168.data;
      if (iVar25 != 0) goto LAB_00108574;
switchD_0010822a_caseD_1:
      lVar22 = *(long *)(pMVar20 + 0x20);
      pMVar20 = pMVar20 + 0x38;
    } while( true );
  }
  goto LAB_00108564;
switchD_0010822a_caseD_0:
  uStack_140 = uStack_140 & 0xffffffffffffff;
  iVar25 = mustache_buffer_insert(&local_168,local_168.n,(void *)((long)&uStack_140 + 7),1);
  pMVar18 = (MUSTACHE_TEMPLATE *)local_e8.data;
  pMVar20 = (MUSTACHE_TEMPLATE *)local_e8.data;
  pMVar26 = (MUSTACHE_TEMPLATE *)local_168.data;
  if (iVar25 == 0) goto LAB_00108582;
  goto LAB_00108574;
}

Assistant:

MUSTACHE_TEMPLATE*
mustache_compile(const char* templ_data, size_t templ_size,
                 const MUSTACHE_PARSER* parser, void* parser_data,
                 unsigned flags)
{
    static const MUSTACHE_PARSER default_parser = { mustache_parse_error };
    MUSTACHE_TAGINFO* tags = NULL;
    unsigned n_tags;
    off_t off;
    off_t jmp_pos;
    MUSTACHE_TAGINFO* tag;
    MUSTACHE_BUFFER insns = { 0 };
    MUSTACHE_STACK jmp_pos_stack = { 0 };
    int done = 0;
    int success = 0;
    size_t indent_len;

    if(parser == NULL)
        parser = &default_parser;

    /* Collect all tags from the template. */
    if(mustache_parse(templ_data, templ_size, parser, parser_data, &tags, &n_tags) != 0)
        goto err;

    /* Build the template */
#define APPEND(data, n)                                                                 \
        do {                                                                            \
            if(mustache_buffer_append(&insns, (data), (n)) != 0)                        \
                goto err;                                                               \
        } while(0)

#define APPEND_NUM(num)                                                                 \
        do {                                                                            \
            if(mustache_buffer_append_num(&insns, (uint64_t)(num)) != 0)                \
                goto err;                                                               \
        } while(0)

#define APPEND_TAGNAME(tag)                                                             \
        do {                                                                            \
            if(mustache_compile_tagname(&insns, templ_data + (tag)->name_beg,           \
                                        (tag)->name_end - (tag)->name_beg) != 0)        \
                goto err;                                                               \
        } while(0)

#define INSERT_NUM(pos, num)                                                            \
        do {                                                                            \
            if(mustache_buffer_insert_num(&insns, (pos), (uint64_t)(num)) != 0)         \
                goto err;                                                               \
        } while(0)

#define PUSH_JMP_POS()                                                                  \
        do {                                                                            \
            if(mustache_stack_push(&jmp_pos_stack, insns.n) != 0)                       \
                goto err;                                                               \
        } while(0)

#define POP_JMP_POS()       ((off_t) mustache_stack_pop(&jmp_pos_stack))

    off = 0;
    tag = &tags[0];
    while(1) {
        if(off < tag->beg) {
            /* Handle literal text before the next tag. */
            APPEND_NUM(MUSTACHE_OP_LITERAL);
            APPEND_NUM(tag->beg - off);
            APPEND(templ_data + off, tag->beg - off);
            off = tag->beg;
        }

        switch(tag->type) {
        case MUSTACHE_TAGTYPE_VAR:
        case MUSTACHE_TAGTYPE_VERBATIMVAR:
        case MUSTACHE_TAGTYPE_VERBATIMVAR2:
            APPEND_NUM(MUSTACHE_OP_RESOLVE);
            APPEND_TAGNAME(tag);
            APPEND_NUM((tag->type == MUSTACHE_TAGTYPE_VAR) ?
                        MUSTACHE_OP_OUTESCAPED : MUSTACHE_OP_OUTVERBATIM);
            break;

        case MUSTACHE_TAGTYPE_OPENSECTION:
            APPEND_NUM(MUSTACHE_OP_RESOLVE_setjmp);
            PUSH_JMP_POS();
            APPEND_TAGNAME(tag);
            APPEND_NUM(MUSTACHE_OP_ENTER);
            PUSH_JMP_POS();
            break;

        case MUSTACHE_TAGTYPE_CLOSESECTION:
            APPEND_NUM(MUSTACHE_OP_LEAVE);
            APPEND_NUM(insns.n - POP_JMP_POS());
            jmp_pos = POP_JMP_POS();
            INSERT_NUM(jmp_pos, insns.n - jmp_pos);
            break;

        case MUSTACHE_TAGTYPE_OPENSECTIONINV:
            APPEND_NUM(MUSTACHE_OP_RESOLVE_setjmp);
            PUSH_JMP_POS();
            APPEND_TAGNAME(tag);
            APPEND_NUM(MUSTACHE_OP_ENTERINV);
            break;

        case MUSTACHE_TAGTYPE_CLOSESECTIONINV:
            jmp_pos = POP_JMP_POS();
            INSERT_NUM(jmp_pos, insns.n - jmp_pos);
            break;

        case MUSTACHE_TAGTYPE_PARTIAL:
            APPEND_NUM(MUSTACHE_OP_PARTIAL);
            APPEND_NUM(tag->name_end - tag->name_beg);
            APPEND(templ_data + tag->name_beg, tag->name_end - tag->name_beg);
            indent_len = 0;
            while(MUSTACHE_ISWHITESPACE(templ_data[tag->beg + indent_len]))
                indent_len++;
            APPEND_NUM(indent_len);
            APPEND(templ_data + tag->beg, indent_len);
            break;

        case MUSTACHE_TAGTYPE_INDENT:
            APPEND_NUM(MUSTACHE_OP_INDENT);
            break;

        case MUSTACHE_TAGTYPE_NONE:
            APPEND_NUM(MUSTACHE_OP_EXIT);
            done = 1;
            break;

        default:
            break;
        }

        if(done)
            break;

        off = tag->end;
        tag++;
    }

    success = 1;

err:
    free(tags);
    mustache_buffer_free(&jmp_pos_stack);
    if(success) {
        return (MUSTACHE_TEMPLATE*) insns.data;
    } else {
        mustache_buffer_free(&insns);
        return NULL;
    }
}